

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qselect.c
# Opt level: O2

double dqselect(int n,double *A,int k)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  if (k < 1) {
    k = 0;
  }
  if (n + -1 <= k) {
    k = n + -1;
  }
  do {
    if (n < 2) {
      return *A;
    }
    uVar6 = (ulong)(n - 1);
    dVar1 = A[uVar6];
    uVar9 = 0;
    uVar8 = uVar6;
    while( true ) {
      iVar7 = (int)uVar8;
      lVar4 = (long)iVar7;
      iVar5 = (int)uVar6;
      if (iVar5 <= (int)uVar9) break;
      lVar11 = (long)(int)uVar9;
      lVar10 = (lVar11 << 0x20) + -0x100000000;
      uVar9 = uVar9 - 1;
      do {
        lVar10 = lVar10 + 0x100000000;
        dVar2 = A[lVar11];
        uVar9 = uVar9 + 1;
        if (dVar2 < dVar1) break;
        bVar3 = lVar11 < lVar4;
        lVar11 = lVar11 + 1;
      } while (bVar3);
      if (dVar2 < dVar1) {
        A[lVar4] = dVar2;
        lVar4 = lVar10 >> 0x20;
        uVar8 = (ulong)uVar9;
      }
      uVar6 = (ulong)(iVar5 + 1);
      lVar11 = (long)iVar5;
      do {
        dVar2 = A[lVar11];
        uVar6 = (ulong)((int)uVar6 - 1);
        if (dVar1 < dVar2) break;
        bVar3 = lVar4 < lVar11;
        lVar11 = lVar11 + -1;
      } while (bVar3);
      if (dVar1 < dVar2) {
        A[lVar4] = dVar2;
        uVar8 = uVar6;
      }
    }
    A[lVar4] = dVar1;
    if (iVar7 == k) {
      return dVar1;
    }
    iVar5 = iVar7 + 1;
    n = n - iVar5;
    if (k < iVar7) {
      iVar5 = 0;
      n = iVar7;
    }
    A = A + iVar5;
    k = k - iVar5;
  } while( true );
}

Assistant:

double dqselect(int n, double A[], int k)
{
    register int i, j, p;
    register double val;

    k = SUPERLU_MAX(k, 0);
    k = SUPERLU_MIN(k, n - 1);
    while (n > 1)
    {
	i = 0; j = n-1;
	p = j; val = A[p];
	while (i < j)
	{
	    for (; A[i] >= val && i < p; i++);
	    if (A[i] < val) { A[p] = A[i]; p = i; }
	    for (; A[j] <= val && j > p; j--);
	    if (A[j] > val) { A[p] = A[j]; p = j; }
	}
	A[p] = val;
	if (p == k) return val;
	else if (p > k) n = p;
	else
	{
	    p++;
	    n -= p; A += p; k -= p;
	}
    }

    return A[0];
}